

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

DebuggerScope * __thiscall
Js::FunctionBody::RecordStartScopeObject
          (FunctionBody *this,DiagExtraScopesType scopeType,int start,RegSlot scopeLocation,
          int *index)

{
  Type index_00;
  Recycler *this_00;
  Type *address;
  bool bVar1;
  Recycler *alloc;
  ScopeObjectChain *this_01;
  undefined **local_68;
  DebuggerScope *debuggerScope;
  size_t local_58;
  char *local_50;
  DWORD local_48;
  Type *local_40;
  int local_38;
  DiagExtraScopesType local_34;
  
  local_34 = scopeType;
  if ((this->m_sourceInfo).pScopeObjectChain.ptr == (ScopeObjectChain *)0x0) {
    local_40 = &(this->m_sourceInfo).pScopeObjectChain;
    this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
    local_68 = &ScopeObjectChain::typeinfo;
    debuggerScope = (DebuggerScope *)0x0;
    local_58 = 0xffffffffffffffff;
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
    ;
    local_48 = 0x1ed0;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)&stack0xffffffffffffff98);
    this_01 = (ScopeObjectChain *)new<Memory::Recycler>(8,alloc,0x38bbb2);
    local_38 = start;
    ScopeObjectChain::ScopeObjectChain(this_01,this_00);
    address = local_40;
    Memory::Recycler::WBSetBit((char *)local_40);
    start = local_38;
    (this->m_sourceInfo).pScopeObjectChain.ptr = this_01;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(address);
  }
  local_68 = (undefined **)0x0;
  index_00 = this->debuggerScopeIndex;
  this->debuggerScopeIndex = index_00 + 1;
  bVar1 = TryGetDebuggerScopeAt(this,index_00,(DebuggerScope **)&stack0xffffffffffffff98);
  if (bVar1) {
    DebuggerScope::UpdateDueToByteCodeRegeneration
              ((DebuggerScope *)local_68,local_34,start,scopeLocation);
  }
  else {
    local_68 = (undefined **)AddScopeObject(this,local_34,start,scopeLocation);
  }
  if (index != (int *)0x0) {
    *index = index_00;
  }
  return (DebuggerScope *)local_68;
}

Assistant:

DebuggerScope* FunctionBody::RecordStartScopeObject(DiagExtraScopesType scopeType, int start, RegSlot scopeLocation, int* index)
    {
        Recycler* recycler = m_scriptContext->GetRecycler();

        if (!GetScopeObjectChain())
        {
            SetScopeObjectChain(RecyclerNew(recycler, ScopeObjectChain, recycler));
        }

        // Check if we need to create the scope object or if it already exists from a previous bytecode
        // generator pass.
        DebuggerScope* debuggerScope = nullptr;
        int currentDebuggerScopeIndex = this->GetNextDebuggerScopeIndex();
        if (!this->TryGetDebuggerScopeAt(currentDebuggerScopeIndex, debuggerScope))
        {
            // Create a new debugger scope.
            debuggerScope = AddScopeObject(scopeType, start, scopeLocation);
        }
        else
        {
            debuggerScope->UpdateDueToByteCodeRegeneration(scopeType, start, scopeLocation);
        }

        if(index)
        {
            *index = currentDebuggerScopeIndex;
        }

        return debuggerScope;
    }